

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plus3.cpp
# Opt level: O3

void __thiscall Electron::Plus3::set_control_register(Plus3 *this,uint8_t control,uint8_t changes)

{
  byte bVar1;
  
  if ((changes & 3) != 0) {
    Storage::Disk::Controller::set_drive((Controller *)this,(uint)(control & 3));
  }
  if ((changes & 4) != 0) {
    bVar1 = control >> 2 & 1;
    Storage::Disk::Drive::set_head
              ((Drive *)(((this->super_WD1770).super_MFMController.super_Controller.drives_.
                          super__Vector_base<std::unique_ptr<Storage::Disk::Drive,_std::default_delete<Storage::Disk::Drive>_>,_std::allocator<std::unique_ptr<Storage::Disk::Drive,_std::default_delete<Storage::Disk::Drive>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                        super___uniq_ptr_impl<Storage::Disk::Drive,_std::default_delete<Storage::Disk::Drive>_>
                        ._M_t,(uint)bVar1);
    Storage::Disk::Drive::set_head
              ((Drive *)(this->super_WD1770).super_MFMController.super_Controller.drives_.
                        super__Vector_base<std::unique_ptr<Storage::Disk::Drive,_std::default_delete<Storage::Disk::Drive>_>,_std::allocator<std::unique_ptr<Storage::Disk::Drive,_std::default_delete<Storage::Disk::Drive>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[1]._M_t.
                        super___uniq_ptr_impl<Storage::Disk::Drive,_std::default_delete<Storage::Disk::Drive>_>
                        ._M_t,(uint)bVar1);
  }
  if ((changes & 8) == 0) {
    return;
  }
  Storage::Disk::MFMController::set_is_double_density((MFMController *)this,(control & 8) == 0);
  return;
}

Assistant:

void Plus3::set_control_register(uint8_t control, uint8_t changes) {
	if(changes&3) {
		set_drive(control&3);
	}

	// Select the side on both drives at once.
	if(changes & 0x04) {
		get_drive(0).set_head((control & 0x04) ? 1 : 0);
		get_drive(1).set_head((control & 0x04) ? 1 : 0);
	}

	if(changes & 0x08) set_is_double_density(!(control & 0x08));
}